

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O2

void __thiscall TestOutput::printTestsEnded(TestOutput *this,TestResult *result)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  _func_int **pp_Var4;
  size_t sVar5;
  char *pcVar6;
  
  (*this->_vptr_TestOutput[0xb])(this,"\n");
  sVar1 = result->runCount_;
  sVar2 = result->failureCount_;
  sVar3 = result->ignoredCount_;
  if (sVar1 == -sVar3 || sVar2 != 0) {
    if (this->color_ != false) {
      (*this->_vptr_TestOutput[0xb])(this,"\x1b[31;1m");
    }
    (*this->_vptr_TestOutput[0xb])(this,"Errors (");
    pp_Var4 = this->_vptr_TestOutput;
    if (sVar2 == 0) {
      pcVar6 = "ran nothing, ";
    }
    else {
      (*pp_Var4[0xd])(this,sVar2);
      pp_Var4 = this->_vptr_TestOutput;
      pcVar6 = " failures, ";
    }
  }
  else {
    if (this->color_ != false) {
      (*this->_vptr_TestOutput[0xb])(this,"\x1b[32;1m");
    }
    pp_Var4 = this->_vptr_TestOutput;
    pcVar6 = "OK (";
  }
  (*pp_Var4[0xb])(this,pcVar6);
  (*this->_vptr_TestOutput[0xd])(this,result->testCount_);
  (*this->_vptr_TestOutput[0xb])(this," tests, ");
  (*this->_vptr_TestOutput[0xd])(this,result->runCount_);
  (*this->_vptr_TestOutput[0xb])(this," ran, ");
  (*this->_vptr_TestOutput[0xd])(this,result->checkCount_);
  (*this->_vptr_TestOutput[0xb])(this," checks, ");
  (*this->_vptr_TestOutput[0xd])(this,result->ignoredCount_);
  (*this->_vptr_TestOutput[0xb])(this," ignored, ");
  (*this->_vptr_TestOutput[0xd])(this,result->filteredOutCount_);
  (*this->_vptr_TestOutput[0xb])(this," filtered out, ");
  sVar5 = TestResult::getTotalExecutionTime(result);
  (*this->_vptr_TestOutput[0xd])(this,sVar5);
  (*this->_vptr_TestOutput[0xb])(this," ms)");
  if (this->color_ == true) {
    (*this->_vptr_TestOutput[0xb])(this,"\x1b[m");
  }
  if (sVar2 == 0 && sVar1 == -sVar3) {
    (*this->_vptr_TestOutput[0xb])
              (this,
               "\nNote: test run failed because no tests were run or ignored. Assuming something went wrong. This often happens because of linking errors or typos in test filter."
              );
  }
  (*this->_vptr_TestOutput[0xb])(this,"\n\n");
  this->dotCount_ = 0;
  return;
}

Assistant:

void TestOutput::printTestsEnded(const TestResult& result)
{
    print("\n");
    const bool isFailure = result.isFailure();
    const size_t failureCount = result.getFailureCount();
    if (isFailure) {
        if (color_) {
            print("\033[31;1m");
        }
        print("Errors (");
        if (failureCount > 0) {
            print(failureCount);
            print(" failures, ");
        }
        else {
            print("ran nothing, ");
        }
    }
    else {
        if (color_) {
            print("\033[32;1m");
        }
        print("OK (");
    }
    print(result.getTestCount());
    print(" tests, ");
    print(result.getRunCount());
    print(" ran, ");
    print(result.getCheckCount());
    print(" checks, ");
    print(result.getIgnoredCount());
    print(" ignored, ");
    print(result.getFilteredOutCount());
    print(" filtered out, ");
    print(result.getTotalExecutionTime());
    print(" ms)");
    if (color_) {
        print("\033[m");
    }
    if (isFailure && failureCount == 0) {
        print("\nNote: test run failed because no tests were run or ignored. Assuming something went wrong. "
              "This often happens because of linking errors or typos in test filter.");
    }
    print("\n\n");

    dotCount_ = 0;
}